

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O2

int __thiscall
CSnapshotDelta::UnpackDelta
          (CSnapshotDelta *this,CSnapshot *pFrom,CSnapshot *pTo,void *pSrcData,int DataSize)

{
  short sVar1;
  uint uVar2;
  CSnapshot *this_00;
  undefined1 *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  void *pvVar9;
  int *piVar10;
  uchar *puVar11;
  ulong uVar12;
  long lVar13;
  undefined1 *puVar14;
  uint *puVar15;
  uint *source;
  long lVar16;
  int i;
  uint Key;
  long lVar17;
  uint size;
  uint *puVar18;
  long in_FS_OFFSET;
  CSnapshotBuilder Builder;
  
  puVar3 = &stack0xffffffffffffffd0;
  do {
    puVar14 = puVar3;
    *(undefined8 *)(puVar14 + -0x1000) = 0;
    puVar3 = puVar14 + -0x1000;
  } while (puVar14 + -0x1000 != Builder.m_aData + 0x10);
  *(undefined8 *)(puVar14 + 0xfff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(puVar14 + 0xeff0) = 0;
  *(undefined4 *)(puVar14 + 0xfff4) = 0;
  *(CSnapshotDelta **)(puVar14 + -0x1060) = this;
  iVar5 = *pSrcData;
  *(undefined8 *)(puVar14 + -0x1070) = 0xffffffffffffffff;
  iVar6 = (int)*(undefined8 *)(puVar14 + -0x1070);
  if (-1 < (long)iVar5) {
    *(CSnapshot **)(puVar14 + -0x1030) = pTo;
    puVar15 = (uint *)((long)pSrcData + (long)iVar5 * 4 + 0xc);
    if ((uint *)((long)DataSize + (long)pSrcData) < puVar15) {
LAB_0013886d:
      *(undefined8 *)(puVar14 + -0x1070) = 0xffffffffffffffff;
LAB_00138ae2:
      iVar6 = (int)*(undefined8 *)(puVar14 + -0x1070);
    }
    else {
      *(uint **)(puVar14 + -0x1048) = (uint *)((long)DataSize + (long)pSrcData);
      *(CSnapshot **)(puVar14 + -0x1040) = pFrom + 1;
      *(CSnapshot **)(puVar14 + -0x1038) = pFrom;
      for (lVar17 = 0; lVar7 = (long)pFrom->m_NumItems, lVar17 < lVar7; lVar17 = lVar17 + 1) {
        puVar18 = (uint *)((long)*(int *)(*(long *)(puVar14 + -0x1040) + lVar7 * 4 + lVar17 * 4) +
                          *(long *)(puVar14 + -0x1040) + lVar7 * 4 + lVar7 * 4);
        *(undefined8 *)(puVar14 + -0x1070) = 0x1388b5;
        uVar4 = CSnapshot::GetItemSize(pFrom,(int)lVar17);
        uVar8 = (ulong)*pSrcData;
        if ((int)*pSrcData < 1) {
          uVar8 = 0;
        }
        uVar12 = 0;
        do {
          if (uVar8 == uVar12) {
            uVar2 = *puVar18;
            *(undefined8 *)(puVar14 + -0x1070) = 0x1388f0;
            pvVar9 = CSnapshotBuilder::NewItem
                               ((CSnapshotBuilder *)(puVar14 + -0x1010),(int)uVar2 >> 0x10,
                                uVar2 & 0xffff,uVar4);
            *(undefined8 *)(puVar14 + -0x1070) = 0x138902;
            mem_copy(pvVar9,puVar18 + 1,uVar4);
            break;
          }
          lVar7 = uVar12 * 4;
          uVar12 = uVar12 + 1;
        } while (*(uint *)((long)pSrcData + lVar7 + 0xc) != *puVar18);
        pFrom = *(CSnapshot **)(puVar14 + -0x1038);
      }
      *(int **)(puVar14 + -0x1028) = &pFrom[1].m_NumItems;
      lVar17 = *(long *)(puVar14 + -0x1060);
      puVar18 = *(uint **)(puVar14 + -0x1048);
      *(void **)(puVar14 + -0x1050) = pSrcData;
      uVar8 = 0;
      while ((int)uVar8 < *(int *)((long)pSrcData + 4)) {
        source = puVar15 + 2;
        if (puVar18 < source) goto LAB_0013886d;
        uVar4 = *puVar15;
        uVar12 = (ulong)uVar4;
        if ((0x7fff < uVar12) || (uVar2 = puVar15[1], 0xffff < uVar2)) {
LAB_00138ae0:
          *(undefined8 *)(puVar14 + -0x1070) = 0xfffffffffffffffd;
          goto LAB_00138ae2;
        }
        if ((0x3f < uVar4) ||
           (sVar1 = *(short *)(lVar17 + uVar12 * 2), size = (uint)sVar1, sVar1 == 0)) {
          if (puVar18 < puVar15 + 3) {
            *(undefined8 *)(puVar14 + -0x1070) = 0xfffffffffffffffe;
            goto LAB_00138ae2;
          }
          if (0x1fffffff < *source) goto LAB_00138ae0;
          size = *source << 2;
          source = puVar15 + 3;
        }
        if (((int)size < 0) || (puVar18 < (uint *)((long)(int)size + (long)source)))
        goto LAB_00138ae0;
        *(ulong *)(puVar14 + -0x1020) = uVar8;
        Key = uVar4 << 0x10 | uVar2;
        *(undefined8 *)(puVar14 + -0x1070) = 0x1389c7;
        piVar10 = CSnapshotBuilder::GetItemData((CSnapshotBuilder *)(puVar14 + -0x1010),Key);
        *(int **)(puVar14 + -0x1058) = piVar10;
        if (piVar10 == (int *)0x0) {
          *(undefined8 *)(puVar14 + -0x1070) = 0x1389e3;
          pvVar9 = CSnapshotBuilder::NewItem
                             ((CSnapshotBuilder *)(puVar14 + -0x1010),uVar4,uVar2,size);
          *(void **)(puVar14 + -0x1058) = pvVar9;
        }
        this_00 = *(CSnapshot **)(puVar14 + -0x1038);
        *(undefined8 *)(puVar14 + -0x1070) = 0x1389f8;
        iVar5 = CSnapshot::GetItemIndex(this_00,Key);
        if (iVar5 == -1) {
          *(undefined8 *)(puVar14 + -0x1070) = 0x138aa3;
          mem_copy(*(void **)(puVar14 + -0x1058),source,size);
          lVar17 = *(long *)(puVar14 + -0x1060);
          piVar10 = (int *)(lVar17 + 0x80 + uVar12 * 4);
          *piVar10 = *piVar10 + size * 8;
          piVar10 = (int *)(lVar17 + 0x20080 + uVar12 * 4);
          *piVar10 = *piVar10 + 1;
        }
        else {
          lVar13 = (long)this_00->m_NumItems;
          iVar5 = *(int *)(*(long *)(puVar14 + -0x1040) + lVar13 * 4 + (long)iVar5 * 4);
          lVar7 = *(long *)(puVar14 + -0x1028);
          lVar17 = *(long *)(puVar14 + -0x1060);
          for (lVar16 = 0; size >> 2 != (uint)lVar16; lVar16 = lVar16 + 1) {
            *(uint *)(*(long *)(puVar14 + -0x1058) + lVar16 * 4) =
                 source[lVar16] + *(int *)((long)iVar5 + lVar13 * 8 + lVar7 + lVar16 * 4);
            uVar4 = source[lVar16];
            if (uVar4 == 0) {
              iVar6 = *(int *)(lVar17 + 0x80 + uVar12 * 4) + 1;
            }
            else {
              *(undefined8 *)(puVar14 + -0x1070) = 0x138a5c;
              puVar11 = CVariableInt::Pack(puVar14 + -0x1015,uVar4);
              lVar17 = *(long *)(puVar14 + -0x1060);
              iVar6 = ((int)puVar11 - (int)(puVar14 + -0x1015)) * 8 +
                      *(int *)(lVar17 + 0x80 + uVar12 * 4);
            }
            *(int *)(lVar17 + 0x80 + uVar12 * 4) = iVar6;
          }
          piVar10 = (int *)(lVar17 + 0x20080 + uVar12 * 4);
          *piVar10 = *piVar10 + 1;
        }
        pSrcData = *(void **)(puVar14 + -0x1050);
        puVar15 = source + (size >> 2);
        puVar18 = *(uint **)(puVar14 + -0x1048);
        uVar8 = (ulong)((int)*(undefined8 *)(puVar14 + -0x1020) + 1);
      }
      *(undefined8 *)(puVar14 + -0x1070) = 0x138b17;
      iVar6 = CSnapshotBuilder::Finish
                        ((CSnapshotBuilder *)(puVar14 + -0x1010),*(void **)(puVar14 + -0x1030));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar14 + 0xfff8)) {
    *(code **)(puVar14 + -0x1070) = CSnapshotBuilder::Init;
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

int CSnapshotDelta::UnpackDelta(const CSnapshot *pFrom, CSnapshot *pTo, const void *pSrcData, int DataSize)
{
	CSnapshotBuilder Builder;
	const CData *pDelta = (const CData *)pSrcData;
	const int *pData = (const int *)pDelta->m_pData;
	const int *pEnd = (const int *)(((const char *)pSrcData + DataSize));

	const CSnapshotItem *pFromItem;
	int Keep, ItemSize;
	const int *pDeleted;
	int ID, Type, Key;
	int FromIndex;
	int *pNewData;

	Builder.Init();

	// unpack deleted stuff
	pDeleted = pData;
	if(pDelta->m_NumDeletedItems < 0)
		return -1;
	pData += pDelta->m_NumDeletedItems;
	if(pData > pEnd)
		return -1;

	// copy all non deleted stuff
	for(int i = 0; i < pFrom->NumItems(); i++)
	{
		// dbg_assert(0, "fail!");
		pFromItem = pFrom->GetItem(i);
		ItemSize = pFrom->GetItemSize(i);
		Keep = 1;
		for(int d = 0; d < pDelta->m_NumDeletedItems; d++)
		{
			if(pDeleted[d] == pFromItem->Key())
			{
				Keep = 0;
				break;
			}
		}

		if(Keep)
		{
			// keep it
			mem_copy(
				Builder.NewItem(pFromItem->Type(), pFromItem->ID(), ItemSize),
				pFromItem->Data(), ItemSize);
		}
	}

	// unpack updated stuff
	for(int i = 0; i < pDelta->m_NumUpdateItems; i++)
	{
		if(pData+2 > pEnd)
			return -1;

		Type = *pData++;
		if(Type < 0 || Type > CSnapshot::MAX_TYPE)
			return -3;

		ID = *pData++;
		if(ID < 0 || ID > CSnapshot::MAX_ID)
			return -3;

		if(Type < MAX_NETOBJSIZES && m_aItemSizes[Type])
			ItemSize = m_aItemSizes[Type];
		else
		{
			if(pData+1 > pEnd)
				return -2;
			if(*pData < 0 || *pData > INT_MAX / 4)
				return -3;
			ItemSize = (*pData++) * 4;
		}

		if(RangeCheck(pEnd, pData, ItemSize) || ItemSize < 0) return -3;

		Key = (Type<<16)|(ID&0xffff);

		// create the item if needed
		pNewData = Builder.GetItemData(Key);
		if(!pNewData)
			pNewData = (int *)Builder.NewItem(Key>>16, Key&0xffff, ItemSize);

		//if(range_check(pEnd, pNewData, ItemSize)) return -4;

		FromIndex = pFrom->GetItemIndex(Key);
		if(FromIndex != -1)
		{
			// we got an update so we need to apply the diff
			UndiffItem(pFrom->GetItem(FromIndex)->Data(), pData, pNewData, ItemSize / 4, &m_aSnapshotDataRate[Type]);
			m_aSnapshotDataUpdates[Type]++;
		}
		else // no previous, just copy the pData
		{
			mem_copy(pNewData, pData, ItemSize);
			m_aSnapshotDataRate[Type] += ItemSize * 8;
			m_aSnapshotDataUpdates[Type]++;
		}

		pData += ItemSize/4;
	}

	// finish up
	return Builder.Finish(pTo);
}